

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplePartitionMap.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::Encodings::Apple::
PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::convert_source_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider> *this,
          ssize_t source_address,vector<unsigned_char,_std::allocator<unsigned_char>_> *source_data)

{
  uchar *__last;
  undefined4 uVar1;
  void *pvVar2;
  initializer_list<unsigned_char> __l;
  _Vector_impl *p_Var3;
  uint8_t *__src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  value_type vVar5;
  ssize_t sVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  size_t sVar8;
  reference pvVar9;
  size_t sVar10;
  uchar *__first;
  allocator<unsigned_char> local_10a;
  allocator<unsigned_char> local_109;
  long local_108;
  ssize_t offset;
  uint8_t *driver;
  char *driver_target;
  uint16_t driver_checksum;
  uint8_t *puStack_e8;
  uint16_t driver_size_1;
  Partition *details;
  char *local_d8;
  Partition partitions [3];
  allocator<unsigned_char> local_63;
  uchar local_62 [4];
  uint8_t local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  iterator local_48;
  size_type local_40;
  undefined1 local_32;
  undefined1 local_31;
  undefined2 local_30;
  undefined2 local_2e;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  uint8_t driver_count;
  uint16_t driver_offset;
  uint16_t driver_size;
  uint32_t total_device_blocks;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *source_data_local;
  ssize_t source_address_local;
  PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider> *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *driver_description;
  
  _driver_offset = source_data;
  source_data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)source_address;
  source_address_local = (ssize_t)this;
  this_local = (PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider> *)
               __return_storage_ptr__;
  if (source_address < 0) {
    sVar6 = non_volume_blocks(this);
    pvVar7 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&(source_data_local->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + sVar6);
    source_data_local = pvVar7;
    if (pvVar7 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      sVar8 = get_number_of_blocks(this);
      _uStack_2c = (undefined4)sVar8;
      sVar6 = driver_block_size(this);
      local_2e = (short)sVar6;
      sVar6 = predriver_blocks(this);
      local_51 = local_2e != 0;
      local_32 = 0;
      builtin_memcpy(local_62,"ER\x02",4);
      local_5e = driver_count;
      local_5d = uStack_2a;
      local_5c = uStack_2b;
      local_5b = uStack_2c;
      local_5a = 0;
      local_59 = 1;
      local_58 = 0;
      local_57 = 1;
      local_56 = 0;
      local_55 = 0;
      local_54 = 0;
      local_53 = 0;
      local_52 = 0;
      local_50 = 0;
      local_4f = 0;
      local_30._1_1_ = (undefined1)((ulong)sVar6 >> 8);
      local_4e = local_30._1_1_;
      local_30._0_1_ = (undefined1)sVar6;
      local_4d = (undefined1)local_30;
      local_4c = local_2e._1_1_;
      local_4b = (undefined1)local_2e;
      local_4a = 0;
      local_49 = 1;
      local_48 = local_62;
      local_40 = 0x1a;
      local_31 = local_51;
      local_30 = (short)sVar6;
      std::allocator<unsigned_char>::allocator(&local_63);
      __l._M_len = local_40;
      __l._M_array = local_48;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__l,&local_63);
      std::allocator<unsigned_char>::~allocator(&local_63);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (__return_storage_ptr__,0x200);
    }
    else if ((long)pvVar7 < 4) {
      local_d8 = Macintosh::VolumeProvider::name((VolumeProvider *)&this->field_0x10);
      partitions[0].name = Macintosh::VolumeProvider::type((VolumeProvider *)&this->field_0x10);
      sVar6 = non_volume_blocks(this);
      partitions[0].type._0_4_ = (undefined4)sVar6;
      partitions[0].type._4_4_ = (undefined4)this->number_of_blocks_;
      partitions[0].start_block._0_1_ = 0xb7;
      partitions[0]._24_8_ = anon_var_dwarf_10125c7;
      partitions[1].name = "Apple_partition_map";
      partitions[1].type._0_4_ = 1;
      sVar6 = predriver_blocks(this);
      partitions[1].type._4_4_ = (int)sVar6 + -1;
      partitions[1].start_block._0_1_ = 0x37;
      partitions[1]._24_8_ = (long)"Apple Macintosh" + 6;
      partitions[2].name = "Apple_Driver";
      sVar6 = predriver_blocks(this);
      partitions[2].type._0_4_ = (undefined4)sVar6;
      sVar6 = driver_block_size(this);
      partitions[2].type._4_4_ = (undefined4)sVar6;
      partitions[2].start_block._0_1_ = 0x7f;
      details._7_1_ = 0;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&details + 6));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,0x200,(allocator<unsigned_char> *)((long)&details + 6));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&details + 6));
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0);
      *pvVar9 = 'P';
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,1);
      *pvVar9 = 'M';
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,7);
      *pvVar9 = '\x03';
      p_Var3 = &source_data_local[-1].
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
      puStack_e8 = &partitions
                    [(long)((long)&(p_Var3->super__Vector_impl_data)._M_end_of_storage + 6)].status;
      uVar1 = *(undefined4 *)
               &partitions[(long)((long)&(p_Var3->super__Vector_impl_data)._M_end_of_storage + 7)].
                type;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,8);
      *pvVar9 = (value_type)((uint)uVar1 >> 0x18);
      uVar1 = *(undefined4 *)(puStack_e8 + 0x10);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,9);
      *pvVar9 = (value_type)((uint)uVar1 >> 0x10);
      uVar1 = *(undefined4 *)(puStack_e8 + 0x10);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,10);
      *pvVar9 = (value_type)((uint)uVar1 >> 8);
      uVar1 = *(undefined4 *)(puStack_e8 + 0x10);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0xb);
      *pvVar9 = (value_type)uVar1;
      vVar5 = (value_type)((uint)*(undefined4 *)(puStack_e8 + 0x14) >> 0x18);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0xc);
      *pvVar9 = vVar5;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x54);
      *pvVar9 = vVar5;
      vVar5 = (value_type)((uint)*(undefined4 *)(puStack_e8 + 0x14) >> 0x10);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0xd);
      *pvVar9 = vVar5;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x55);
      *pvVar9 = vVar5;
      vVar5 = (value_type)((uint)*(undefined4 *)(puStack_e8 + 0x14) >> 8);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0xe);
      *pvVar9 = vVar5;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x56);
      *pvVar9 = vVar5;
      uVar1 = *(undefined4 *)(puStack_e8 + 0x14);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0xf);
      *pvVar9 = (value_type)uVar1;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x57);
      *pvVar9 = (value_type)uVar1;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x10);
      pvVar2 = *(void **)puStack_e8;
      sVar10 = strlen(*(char **)puStack_e8);
      memcpy(pvVar9,pvVar2,sVar10);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x30);
      pvVar2 = *(void **)(puStack_e8 + 8);
      sVar10 = strlen(*(char **)(puStack_e8 + 8));
      memcpy(pvVar9,pvVar2,sVar10);
      vVar5 = puStack_e8[0x18];
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,0x5b);
      *pvVar9 = vVar5;
      if (source_data_local == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3) {
        sVar8 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)&this->field_0x10);
        driver_target._6_2_ = (undefined2)sVar8;
        driver_target._4_2_ =
             Macintosh::VolumeProvider::driver_checksum((VolumeProvider *)&this->field_0x10);
        vVar5 = driver_target._7_1_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x62);
        *pvVar9 = vVar5;
        vVar5 = driver_target._6_1_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,99);
        *pvVar9 = vVar5;
        vVar5 = driver_target._5_1_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x76);
        *pvVar9 = vVar5;
        vVar5 = driver_target._4_1_;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x77);
        *pvVar9 = vVar5;
        driver = (uint8_t *)
                 Macintosh::VolumeProvider::driver_target((VolumeProvider *)&this->field_0x10);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x78);
        __src = driver;
        sVar10 = strlen((char *)driver);
        memcpy(pvVar9,__src,sVar10);
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x89);
        *pvVar9 = '\x01';
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x8a);
        *pvVar9 = '\x06';
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x8f);
        *pvVar9 = '\x01';
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x93);
        *pvVar9 = '\x02';
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0x95);
        *pvVar9 = '\a';
      }
    }
    else {
      sVar6 = predriver_blocks(this);
      pvVar4 = source_data_local;
      if (((long)pvVar7 < sVar6) || (sVar6 = non_volume_blocks(this), sVar6 <= (long)pvVar4)) {
        std::allocator<unsigned_char>::allocator(&local_10a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (__return_storage_ptr__,0x200,&local_10a);
        std::allocator<unsigned_char>::~allocator(&local_10a);
      }
      else {
        offset = (ssize_t)Macintosh::VolumeProvider::driver((VolumeProvider *)&this->field_0x10);
        pvVar7 = source_data_local;
        sVar6 = predriver_blocks(this);
        local_108 = ((long)pvVar7 - sVar6) * 0x200;
        __first = (uchar *)(offset + local_108);
        __last = (uchar *)(offset + 0x200 + local_108);
        std::allocator<unsigned_char>::allocator(&local_109);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   __first,__last,&local_109);
        std::allocator<unsigned_char>::~allocator(&local_109);
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,source_data);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convert_source_block(ssize_t source_address, std::vector<uint8_t> source_data = {}) {
			// Addresses greater than or equal to zero map to the actual disk image.
			if(source_address >= 0) return source_data;

			// Switch to mapping relative to 0, for personal sanity.
			source_address += non_volume_blocks();

			// Block 0 is the device descriptor, which lists the total number of blocks,
			// and provides an offset to the driver, if any.
			if(!source_address) {
				const uint32_t total_device_blocks = uint32_t(get_number_of_blocks());
				const auto driver_size = uint16_t(driver_block_size());
				const auto driver_offset = uint16_t(predriver_blocks());
				const uint8_t driver_count = driver_size > 0 ? 1 : 0;

				/* The driver descriptor. */
				std::vector<uint8_t> driver_description = {
					0x45, 0x52,		/* device signature */
					0x02, 0x00,		/* block size, in bytes */

					uint8_t(total_device_blocks >> 24),
					uint8_t(total_device_blocks >> 16),
					uint8_t(total_device_blocks >> 8),
					uint8_t(total_device_blocks),
									/* number of blocks on device */

					0x00, 0x01,		/* reserved (formerly: device type) */
					0x00, 0x01,		/* reserved (formerly: device ID) */
					0x00, 0x00,
					0x00, 0x00,		/* reserved ('sbData', no further explanation given) */

					0x00, driver_count,		/* number of device descriptor entries */
					0x00, 0x00,

					/* first device descriptor's starting block */
					uint8_t(driver_offset >> 8), uint8_t(driver_offset),

					/* size of device driver */
					uint8_t(driver_size >> 8), uint8_t(driver_size),

					0x00, 0x01,		/*
										More modern documentation: operating system (MacOS = 1)
										Inside Macintosh IV: system type (Mac Plus = 1)
									*/
				};
				driver_description.resize(512);

				return driver_description;
			}

			// Blocks 1 and 2 contain entries of the partition map; there's also possibly an entry
			// for the driver.
			if(source_address < 3 + volume_provider_.HasDriver) {
				struct Partition {
					const char *name, *type;
					uint32_t start_block, size;
					uint8_t status;
				} partitions[3] = {
					{
						volume_provider_.name(),
						volume_provider_.type(),
						uint32_t(non_volume_blocks()),
						uint32_t(number_of_blocks_),
						0xb7
					},
					{
						"Apple",
						"Apple_partition_map",
						0x01,
						uint32_t(predriver_blocks()) - 1,
						0x37
					},
					{
						"Macintosh",
						"Apple_Driver",
						uint32_t(predriver_blocks()),
						uint32_t(driver_block_size()),
						0x7f
					},
				};

				std::vector<uint8_t> partition(512);

				// Fill in the fixed fields.
				partition[0] = 'P';	partition[1] = 'M';	/* Signature. */
				partition[7] = 3;						/* Number of partitions. */

				const Partition &details = partitions[source_address-1];

				partition[8] = uint8_t(details.start_block >> 24);
				partition[9] = uint8_t(details.start_block >> 16);
				partition[10] = uint8_t(details.start_block >> 8);
				partition[11] = uint8_t(details.start_block);

				partition[84] = partition[12] = uint8_t(details.size >> 24);
				partition[85] = partition[13] = uint8_t(details.size >> 16);
				partition[86] = partition[14] = uint8_t(details.size >> 8);
				partition[87] = partition[15] = uint8_t(details.size);

				// 32 bytes are allocated for each of the following strings.
				memcpy(&partition[16], details.name, strlen(details.name));
				memcpy(&partition[48], details.type, strlen(details.type));

				partition[91] = details.status;

				// The third entry in this constructed partition map is the driver;
				// add some additional details.
				if constexpr (VolumeProvider::HasDriver) {
					if(source_address == 3) {
						const auto driver_size = uint16_t(volume_provider_.driver_size());
						const auto driver_checksum = uint16_t(volume_provider_.driver_checksum());

						/* Driver size in bytes. */
						partition[98] = uint8_t(driver_size >> 8);
						partition[99] = uint8_t(driver_size);

						/* Driver checksum. */
						partition[118] = uint8_t(driver_checksum >> 8);
						partition[119] = uint8_t(driver_checksum);

						/* Driver target processor. */
						const char *driver_target = volume_provider_.driver_target();
						memcpy(&partition[120], driver_target, strlen(driver_target));

						// Various non-zero values that Apple HD SC Tool wrote are below; they are
						// documented as reserved officially, so I don't know their meaning.
						partition[137] = 0x01;
						partition[138] = 0x06;
						partition[143] = 0x01;
						partition[147] = 0x02;
						partition[149] = 0x07;
					}
				}

				return partition;
			}

			if constexpr (VolumeProvider::HasDriver) {
				// The remainder of the non-volume area is the driver.
				if(source_address >= predriver_blocks() && source_address < non_volume_blocks()) {
					const uint8_t *driver = volume_provider_.driver();
					const auto offset = (source_address - predriver_blocks()) * 512;
					return std::vector<uint8_t>(&driver[offset], &driver[offset + 512]);
				}
			}

			// Default: return an empty block.
			return std::vector<uint8_t>(512);
		}